

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

int Sbl_ManCreateCnf(Sbl_Man_t *p)

{
  sat_solver *psVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  word *pwVar6;
  word *pwVar7;
  int *piVar8;
  int *end;
  ulong local_50;
  word Cut2;
  word Cut1;
  int Limit0;
  int Start0;
  word *pCutsN2;
  word *pCutsN1;
  int value;
  int pLits [2];
  int c;
  int k;
  int i;
  Sbl_Man_t *p_local;
  
  pwVar6 = Vec_WrdArray(p->vCutsN1);
  pwVar7 = Vec_WrdArray(p->vCutsN2);
  iVar4 = p->FirstVar;
  iVar3 = sat_solver_nvars(p->pSat);
  if (iVar4 != iVar3) {
    __assert_fail("p->FirstVar == sat_solver_nvars(p->pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                  ,0x356,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
  }
  psVar1 = p->pSat;
  iVar4 = sat_solver_nvars(p->pSat);
  iVar3 = Vec_WrdSize(p->vCutsI1);
  sat_solver_setnvars(psVar1,iVar4 + iVar3);
  c = 0;
  while( true ) {
    iVar4 = Vec_IntSize(p->vAnds);
    if (iVar4 <= c) {
      psVar1 = p->pSat;
      piVar8 = Vec_IntArray(p->vPolar);
      iVar4 = Vec_IntSize(p->vPolar);
      sat_solver_set_polarity(psVar1,piVar8,iVar4);
      return 1;
    }
    pVVar2 = p->vCutsStart;
    iVar4 = Vec_IntSize(p->vLeaves);
    iVar4 = Vec_IntEntry(pVVar2,iVar4 + c);
    pVVar2 = p->vCutsNum;
    iVar3 = Vec_IntSize(p->vLeaves);
    iVar3 = Vec_IntEntry(pVVar2,iVar3 + c);
    iVar3 = iVar4 + iVar3 + -1;
    Vec_IntClear(p->vLits);
    pVVar2 = p->vLits;
    iVar5 = Abc_Var2Lit(c,1);
    Vec_IntPush(pVVar2,iVar5);
    for (pLits[1] = iVar4; pLits[1] < iVar3; pLits[1] = pLits[1] + 1) {
      pVVar2 = p->vLits;
      iVar5 = Abc_Var2Lit(p->FirstVar + pLits[1],0);
      Vec_IntPush(pVVar2,iVar5);
    }
    psVar1 = p->pSat;
    piVar8 = Vec_IntArray(p->vLits);
    end = Vec_IntLimit(p->vLits);
    pCutsN1._0_4_ = sat_solver_addclause(psVar1,piVar8,end);
    if ((int)pCutsN1 == 0) break;
    while (pLits[1] = iVar4, pLits[1] < iVar3) {
      Cut2 = pwVar6[pLits[1]];
      local_50 = pwVar7[pLits[1]];
      pCutsN1._4_4_ = Abc_Var2Lit(p->FirstVar + pLits[1],1);
      value = Abc_Var2Lit(c,0);
      pCutsN1._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&pCutsN1 + 4),pLits);
      if ((int)pCutsN1 == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                      ,0x373,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
      }
      for (pLits[0] = 0; pLits[0] < 0x40 && Cut2 != 0; pLits[0] = pLits[0] + 1) {
        if ((Cut2 & 1) != 0) {
          value = Abc_Var2Lit(pLits[0],0);
          pCutsN1._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&pCutsN1 + 4),pLits);
          if ((int)pCutsN1 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x37c,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
          }
        }
        Cut2 = Cut2 >> 1;
      }
      for (pLits[0] = 0; pLits[0] < 0x40 && local_50 != 0; pLits[0] = pLits[0] + 1) {
        if ((local_50 & 1) != 0) {
          value = Abc_Var2Lit(pLits[0] + 0x40,0);
          pCutsN1._0_4_ = sat_solver_addclause(p->pSat,(lit *)((long)&pCutsN1 + 4),pLits);
          if ((int)pCutsN1 == 0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                          ,0x385,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
          }
        }
        local_50 = local_50 >> 1;
      }
      iVar4 = pLits[1] + 1;
    }
    c = c + 1;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLut.c"
                ,0x368,"int Sbl_ManCreateCnf(Sbl_Man_t *)");
}

Assistant:

int Sbl_ManCreateCnf( Sbl_Man_t * p )
{
    int i, k, c, pLits[2], value;
    word * pCutsN1 = Vec_WrdArray(p->vCutsN1);
    word * pCutsN2 = Vec_WrdArray(p->vCutsN2);
    assert( p->FirstVar == sat_solver_nvars(p->pSat) );
    sat_solver_setnvars( p->pSat, sat_solver_nvars(p->pSat) + Vec_WrdSize(p->vCutsI1) );
    //printf( "\n" );
    for ( i = 0; i < Vec_IntSize(p->vAnds); i++ )
    {
        int Start0 = Vec_IntEntry( p->vCutsStart, Vec_IntSize(p->vLeaves) + i );
        int Limit0 = Start0 + Vec_IntEntry( p->vCutsNum, Vec_IntSize(p->vLeaves) + i ) - 1;
        // add main clause
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_Var2Lit(i, 1) );
        //printf( "Node %d implies cuts: ", i );
        for ( k = Start0; k < Limit0; k++ )
        {
            Vec_IntPush( p->vLits, Abc_Var2Lit(p->FirstVar+k, 0) );
            //printf( "%d ", p->FirstVar+k );
        }
        //printf( "\n" );
        value = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntLimit(p->vLits)  );
        assert( value );
        // binary clauses
        for ( k = Start0; k < Limit0; k++ )
        {
            word Cut1 = pCutsN1[k];
            word Cut2 = pCutsN2[k];
            //printf( "Cut %d implies root node %d.\n", p->FirstVar+k, i );
            // root clause
            pLits[0] = Abc_Var2Lit( p->FirstVar+k, 1 );
            pLits[1] = Abc_Var2Lit( i, 0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
            assert( value );
            // fanin clauses
            for ( c = 0; c < 64 && Cut1; c++, Cut1 >>= 1 )
            {
                if ( (Cut1 & 1) == 0 )
                    continue;
                //printf( "Cut %d implies fanin %d.\n", p->FirstVar+k, c );
                pLits[1] = Abc_Var2Lit( c, 0 );
                value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
                assert( value );
            }
            for ( c = 0; c < 64 && Cut2; c++, Cut2 >>= 1 )
            {
                if ( (Cut2 & 1) == 0 )
                    continue;
                //printf( "Cut %d implies fanin %d.\n", p->FirstVar+k, c );
                pLits[1] = Abc_Var2Lit( c+64, 0 );
                value = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
                assert( value );
            }
        }
    }
    sat_solver_set_polarity( p->pSat, Vec_IntArray(p->vPolar), Vec_IntSize(p->vPolar) );
    return 1;
}